

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uintwide_t.h
# Opt level: O0

bool math::wide_integer::
     miller_rabin<math::wide_integer::uniform_int_distribution<2048u,unsigned_int,std::allocator<unsigned_int>,false>,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>,2048u,unsigned_int,std::allocator<unsigned_int>,false>
               (uintwide_t<2048U,_unsigned_int,_std::allocator<unsigned_int>,_false> *n,
               unsigned_fast_type number_of_trials,
               uniform_int_distribution<2048U,_unsigned_int,_std::allocator<unsigned_int>,_false>
               *distribution,
               mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
               *generator)

{
  bool bVar1;
  const_iterator first;
  const_iterator last;
  unsigned_long uVar2;
  unsigned_fast_type uVar3;
  uintwide_t<2048U,_unsigned_int,_std::allocator<unsigned_int>,_false> *in_R8;
  byte local_3f5;
  byte local_3f2;
  enable_if_t<std::is_integral<unsigned_int>::value,_bool> local_369;
  enable_if_t<std::is_integral<unsigned_int>::value,_bool> local_367;
  enable_if_t<std::is_integral<unsigned_int>::value,_bool> local_365;
  uintwide_t<2048U,_unsigned_int,_std::allocator<unsigned_int>,_false> local_360;
  undefined1 local_348 [8];
  local_double_width_type yd;
  size_t jdx;
  undefined1 local_310 [8];
  local_wide_integer_type y;
  local_double_width_type np_dbl;
  size_t idx;
  undefined1 local_2d0 [3];
  bool result_candidate_is_prime;
  result_type local_2b8;
  undefined1 local_2a0 [8];
  local_param_type params;
  local_wide_integer_type q;
  undefined1 local_250 [4];
  uint k;
  undefined1 local_238 [8];
  local_wide_integer_type fn;
  undefined1 local_218 [3];
  anon_class_1_0_00000001 local_functor_isone;
  local_wide_integer_type nm1;
  uint64_t m4;
  uint64_t pp4;
  unsigned_long local_1c0;
  uint64_t m3;
  uint64_t pp3;
  unsigned_long local_198;
  uint64_t m2;
  uint64_t pp2;
  unsigned_long local_170;
  uint64_t m1;
  uint64_t pp1;
  unsigned_long local_148;
  uint64_t m0;
  uint64_t pp0;
  array<unsigned_int,_48UL> small_primes;
  uint local_6c;
  uint uStack_68;
  bool n_is_one;
  uint local_64;
  enable_if_t<std::is_integral<unsigned_int>::value,_bool> local_5e;
  undefined1 local_5d;
  bool n_is_two;
  bool n_is_even;
  uint local_4c;
  undefined1 local_48 [4];
  local_limb_type n0;
  local_wide_integer_type np;
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  *generator_local;
  uniform_int_distribution<2048U,_unsigned_int,_std::allocator<unsigned_int>,_false>
  *distribution_local;
  unsigned_fast_type number_of_trials_local;
  uintwide_t<2048U,_unsigned_int,_std::allocator<unsigned_int>,_false> *n_local;
  
  np.values.super_dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>.elems
       = (pointer)generator;
  bVar1 = uintwide_t<2048U,_unsigned_int,_std::allocator<unsigned_int>,_false>::is_neg<false>
                    (n,(enable_if_t<(_false),_int> *)0x0);
  if (bVar1) {
    uintwide_t<2048U,_unsigned_int,_std::allocator<unsigned_int>,_false>::operator-
              ((uintwide_t<2048U,_unsigned_int,_std::allocator<unsigned_int>,_false> *)local_48,n);
  }
  else {
    uintwide_t<2048U,_unsigned_int,_std::allocator<unsigned_int>,_false>::uintwide_t
              ((uintwide_t<2048U,_unsigned_int,_std::allocator<unsigned_int>,_false> *)local_48,n);
  }
  local_4c = uintwide_t::operator_cast_to_unsigned_int((uintwide_t *)local_48);
  local_5d = (local_4c & 1) == 0;
  if ((bool)local_5d) {
    local_365 = false;
    if (local_4c == 2) {
      local_64 = 2;
      local_365 = operator==((uintwide_t<2048U,_unsigned_int,_std::allocator<unsigned_int>,_false> *
                             )local_48,&local_64);
    }
    local_5e = local_365;
    n_local._7_1_ = local_365;
    uStack_68 = 1;
  }
  else {
    local_367 = false;
    if (local_4c < 0xe4) {
      local_6c = 0xe3;
      local_367 = operator<=((uintwide_t<2048U,_unsigned_int,_std::allocator<unsigned_int>,_false> *
                             )local_48,&local_6c);
    }
    if (local_367 == false) {
      m0 = 0xe221f97c30e94e1d;
      operator%((enable_if_t<(std::is_integral<unsigned_long>::value_&&_std::is_unsigned<unsigned_long>::value_&&_(std::numeric_limits<unsigned_long>::digits_>_std__numeric_limits<unsigned_int>__digits____uintwide_t<2048U,_unsigned_int,_allocator<unsigned_int>,_false>_>
                 *)&pp1,(uintwide_t<2048U,_unsigned_int,_std::allocator<unsigned_int>,_false> *)
                        local_48,&m0);
      uVar2 = uintwide_t::operator_cast_to_unsigned_long((uintwide_t *)&pp1);
      uintwide_t<2048U,_unsigned_int,_std::allocator<unsigned_int>,_false>::~uintwide_t
                ((uintwide_t<2048U,_unsigned_int,_std::allocator<unsigned_int>,_false> *)&pp1);
      local_148 = uVar2;
      if ((uVar2 == 0) ||
         (uVar2 = detail::integer_gcd_reduce<unsigned_long>(uVar2,0xe221f97c30e94e1d), uVar2 != 1))
      {
        n_local._7_1_ = 0;
        uStack_68 = 1;
      }
      else {
        m1 = 0x6329899ea9f2714b;
        operator%((enable_if_t<(std::is_integral<unsigned_long>::value_&&_std::is_unsigned<unsigned_long>::value_&&_(std::numeric_limits<unsigned_long>::digits_>_std__numeric_limits<unsigned_int>__digits____uintwide_t<2048U,_unsigned_int,_allocator<unsigned_int>,_false>_>
                   *)&pp2,(uintwide_t<2048U,_unsigned_int,_std::allocator<unsigned_int>,_false> *)
                          local_48,&m1);
        uVar2 = uintwide_t::operator_cast_to_unsigned_long((uintwide_t *)&pp2);
        uintwide_t<2048U,_unsigned_int,_std::allocator<unsigned_int>,_false>::~uintwide_t
                  ((uintwide_t<2048U,_unsigned_int,_std::allocator<unsigned_int>,_false> *)&pp2);
        local_170 = uVar2;
        if ((uVar2 == 0) ||
           (uVar2 = detail::integer_gcd_reduce<unsigned_long>(uVar2,0x6329899ea9f2714b), uVar2 != 1)
           ) {
          n_local._7_1_ = 0;
          uStack_68 = 1;
        }
        else {
          m2 = 0x58edcb4c9ed39c8b;
          operator%((enable_if_t<(std::is_integral<unsigned_long>::value_&&_std::is_unsigned<unsigned_long>::value_&&_(std::numeric_limits<unsigned_long>::digits_>_std__numeric_limits<unsigned_int>__digits____uintwide_t<2048U,_unsigned_int,_allocator<unsigned_int>,_false>_>
                     *)&pp3,(uintwide_t<2048U,_unsigned_int,_std::allocator<unsigned_int>,_false> *)
                            local_48,&m2);
          uVar2 = uintwide_t::operator_cast_to_unsigned_long((uintwide_t *)&pp3);
          uintwide_t<2048U,_unsigned_int,_std::allocator<unsigned_int>,_false>::~uintwide_t
                    ((uintwide_t<2048U,_unsigned_int,_std::allocator<unsigned_int>,_false> *)&pp3);
          local_198 = uVar2;
          if ((uVar2 == 0) ||
             (uVar2 = detail::integer_gcd_reduce<unsigned_long>(uVar2,0x58edcb4c9ed39c8b),
             uVar2 != 1)) {
            n_local._7_1_ = 0;
            uStack_68 = 1;
          }
          else {
            m3 = 0x9966ff94fd516fb;
            operator%((enable_if_t<(std::is_integral<unsigned_long>::value_&&_std::is_unsigned<unsigned_long>::value_&&_(std::numeric_limits<unsigned_long>::digits_>_std__numeric_limits<unsigned_int>__digits____uintwide_t<2048U,_unsigned_int,_allocator<unsigned_int>,_false>_>
                       *)&pp4,(uintwide_t<2048U,_unsigned_int,_std::allocator<unsigned_int>,_false>
                               *)local_48,&m3);
            uVar2 = uintwide_t::operator_cast_to_unsigned_long((uintwide_t *)&pp4);
            uintwide_t<2048U,_unsigned_int,_std::allocator<unsigned_int>,_false>::~uintwide_t
                      ((uintwide_t<2048U,_unsigned_int,_std::allocator<unsigned_int>,_false> *)&pp4)
            ;
            local_1c0 = uVar2;
            if ((uVar2 == 0) ||
               (uVar2 = detail::integer_gcd_reduce<unsigned_long>(uVar2,0x9966ff94fd516fb),
               uVar2 != 1)) {
              n_local._7_1_ = 0;
              uStack_68 = 1;
            }
            else {
              m4 = 0x49801d135ff5;
              operator%((enable_if_t<(std::is_integral<unsigned_long>::value_&&_std::is_unsigned<unsigned_long>::value_&&_(std::numeric_limits<unsigned_long>::digits_>_std__numeric_limits<unsigned_int>__digits____uintwide_t<2048U,_unsigned_int,_allocator<unsigned_int>,_false>_>
                         *)&nm1.values.
                            super_dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>
                            .elems,
                        (uintwide_t<2048U,_unsigned_int,_std::allocator<unsigned_int>,_false> *)
                        local_48,&m4);
              uVar2 = uintwide_t::operator_cast_to_unsigned_long
                                ((uintwide_t *)
                                 &nm1.values.
                                  super_dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>
                                  .elems);
              uintwide_t<2048U,_unsigned_int,_std::allocator<unsigned_int>,_false>::~uintwide_t
                        ((uintwide_t<2048U,_unsigned_int,_std::allocator<unsigned_int>,_false> *)
                         &nm1.values.
                          super_dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>
                          .elems);
              if ((uVar2 == 0) ||
                 (uVar2 = detail::integer_gcd_reduce<unsigned_long>(uVar2,0x49801d135ff5),
                 uVar2 != 1)) {
                n_local._7_1_ = 0;
                uStack_68 = 1;
              }
              else {
                fn.values.
                super_dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>.
                elems._4_4_ = 1;
                operator-((enable_if_t<std::is_integral<unsigned_int>::value,_uintwide_t<2048U,_unsigned_int,_allocator<unsigned_int>,_false>_>
                           *)local_218,
                          (uintwide_t<2048U,_unsigned_int,_std::allocator<unsigned_int>,_false> *)
                          local_48,(uint *)((long)&fn.values.
                                                                                                      
                                                  super_dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>
                                                  .elems + 4));
                fn.values.
                super_dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>.
                elems._3_1_ = 0;
                uintwide_t<2048u,unsigned_int,std::allocator<unsigned_int>,false>::
                uintwide_t<unsigned_int>(unsigned_int,std::enable_if<(std::is_integral<unsigned_int>
                ::value&&std::is_unsigned<unsigned_int>::value)&&(std::numeric_limits<unsigned_int>
                ::digits<=std::numeric_limits<unsigned_int>::digits),void>::type__
                          (local_250,0xe4,
                           (enable_if_t<(std::is_integral<unsigned_int>::value_&&_std::is_unsigned<unsigned_int>::value_&&_(std::numeric_limits<unsigned_int>::digits_<__std::numeric_limits<limb_type>::digits))>
                            *)0x0);
                powm<math::wide_integer::uintwide_t<2048u,unsigned_int,std::allocator<unsigned_int>,false>,math::wide_integer::uintwide_t<2048u,unsigned_int,std::allocator<unsigned_int>,false>,2048u,unsigned_int,std::allocator<unsigned_int>,false>
                          ((uintwide_t<2048U,_unsigned_int,_std::allocator<unsigned_int>,_false> *)
                           local_238,(wide_integer *)local_250,
                           (uintwide_t<2048U,_unsigned_int,_std::allocator<unsigned_int>,_false> *)
                           local_218,
                           (uintwide_t<2048U,_unsigned_int,_std::allocator<unsigned_int>,_false> *)
                           local_48,in_R8);
                uintwide_t<2048U,_unsigned_int,_std::allocator<unsigned_int>,_false>::~uintwide_t
                          ((uintwide_t<2048U,_unsigned_int,_std::allocator<unsigned_int>,_false> *)
                           local_250);
                bVar1 = miller_rabin<math::wide_integer::uniform_int_distribution<2048U,_unsigned_int,_std::allocator<unsigned_int>,_false>,_std::mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>,_2048U,_unsigned_int,_std::allocator<unsigned_int>,_false>
                        ::anon_class_1_0_00000001::operator()
                                  ((anon_class_1_0_00000001 *)
                                   ((long)&fn.values.
                                           super_dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>
                                           .elems + 3),(local_wide_integer_type *)local_238);
                if (!bVar1) {
                  n_local._7_1_ = 0;
                }
                uStack_68 = (uint)!bVar1;
                uintwide_t<2048U,_unsigned_int,_std::allocator<unsigned_int>,_false>::~uintwide_t
                          ((uintwide_t<2048U,_unsigned_int,_std::allocator<unsigned_int>,_false> *)
                           local_238);
                if (uStack_68 == 0) {
                  uVar3 = lsb<2048u,unsigned_int,std::allocator<unsigned_int>,false>
                                    ((uintwide_t<2048U,_unsigned_int,_std::allocator<unsigned_int>,_false>
                                      *)local_218);
                  operator>>((enable_if_t<std::is_integral<unsigned_int>::value,_uintwide_t<2048U,_unsigned_int,_allocator<unsigned_int>,_false>_>
                              *)&params.param_b.values.
                                 super_dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>
                                 .elems,
                             (uintwide_t<2048U,_unsigned_int,_std::allocator<unsigned_int>,_false> *
                             )local_218,(uint)uVar3);
                  uintwide_t<2048u,unsigned_int,std::allocator<unsigned_int>,false>::
                  uintwide_t<unsigned_int>(unsigned_int,std::enable_if<(std::
                  is_integral<unsigned_int>::value&&std::is_unsigned<unsigned_int>::value)&&(std::
                  numeric_limits<unsigned_int>::digits<=std::numeric_limits<unsigned_int>::
                  digits),void>::type__
                            (&local_2b8,2,
                             (enable_if_t<(std::is_integral<unsigned_int>::value_&&_std::is_unsigned<unsigned_int>::value_&&_(std::numeric_limits<unsigned_int>::digits_<__std::numeric_limits<limb_type>::digits))>
                              *)0x0);
                  idx._4_4_ = 2;
                  operator-((enable_if_t<std::is_integral<unsigned_int>::value,_uintwide_t<2048U,_unsigned_int,_allocator<unsigned_int>,_false>_>
                             *)local_2d0,
                            (uintwide_t<2048U,_unsigned_int,_std::allocator<unsigned_int>,_false> *)
                            local_48,(uint *)((long)&idx + 4));
                  uniform_int_distribution<2048U,_unsigned_int,_std::allocator<unsigned_int>,_false>
                  ::param_type::param_type
                            ((param_type *)local_2a0,&local_2b8,(result_type *)local_2d0);
                  uintwide_t<2048U,_unsigned_int,_std::allocator<unsigned_int>,_false>::~uintwide_t
                            ((uintwide_t<2048U,_unsigned_int,_std::allocator<unsigned_int>,_false> *
                             )local_2d0);
                  uintwide_t<2048U,_unsigned_int,_std::allocator<unsigned_int>,_false>::~uintwide_t
                            (&local_2b8);
                  idx._3_1_ = 1;
                  np_dbl.values.
                  super_dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>
                  .elems = (pointer)0x0;
                  uintwide_t<4096U,_unsigned_int,_std::allocator<unsigned_int>,_false>::
                  uintwide_t<2048U,_false,_nullptr>
                            ((uintwide_t<4096U,_unsigned_int,_std::allocator<unsigned_int>,_false> *
                             )&y.values.
                               super_dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>
                               .elems,(uintwide_t<2048U,_unsigned_int,_std::allocator<unsigned_int>,_false>
                                       *)local_48);
                  do {
                    uniform_int_distribution<2048u,unsigned_int,std::allocator<unsigned_int>,false>
                    ::operator()((result_type *)&jdx,distribution,
                                 (mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                                  *)np.values.
                                    super_dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>
                                    .elems,(param_type *)local_2a0);
                    powm<math::wide_integer::uintwide_t<2048u,unsigned_int,std::allocator<unsigned_int>,false>,math::wide_integer::uintwide_t<2048u,unsigned_int,std::allocator<unsigned_int>,false>,2048u,unsigned_int,std::allocator<unsigned_int>,false>
                              ((uintwide_t<2048U,_unsigned_int,_std::allocator<unsigned_int>,_false>
                                *)local_310,(wide_integer *)&jdx,
                               (uintwide_t<2048U,_unsigned_int,_std::allocator<unsigned_int>,_false>
                                *)&params.param_b.values.
                                   super_dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>
                                   .elems,
                               (uintwide_t<2048U,_unsigned_int,_std::allocator<unsigned_int>,_false>
                                *)local_48,in_R8);
                    uintwide_t<2048U,_unsigned_int,_std::allocator<unsigned_int>,_false>::
                    ~uintwide_t((uintwide_t<2048U,_unsigned_int,_std::allocator<unsigned_int>,_false>
                                 *)&jdx);
                    yd.values.
                    super_dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>
                    .elems = (pointer)0x0;
                    while( true ) {
                      bVar1 = uintwide_t<2048U,_unsigned_int,_std::allocator<unsigned_int>,_false>::
                              operator!=((uintwide_t<2048U,_unsigned_int,_std::allocator<unsigned_int>,_false>
                                          *)local_310,
                                         (uintwide_t<2048U,_unsigned_int,_std::allocator<unsigned_int>,_false>
                                          *)local_218);
                      local_3f2 = 0;
                      if (bVar1) {
                        bVar1 = miller_rabin<math::wide_integer::uniform_int_distribution<2048U,_unsigned_int,_std::allocator<unsigned_int>,_false>,_std::mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>,_2048U,_unsigned_int,_std::allocator<unsigned_int>,_false>
                                ::anon_class_1_0_00000001::operator()
                                          ((anon_class_1_0_00000001 *)
                                           ((long)&fn.values.
                                                                                                      
                                                  super_dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>
                                                  .elems + 3),(local_wide_integer_type *)local_310);
                        local_3f2 = 0;
                        if (!bVar1) {
                          local_3f2 = idx._3_1_;
                        }
                      }
                      if ((local_3f2 & 1) == 0) break;
                      yd.values.
                      super_dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>
                      .elems = (pointer)((long)yd.values.
                                               super_dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>
                                               .elems + 1);
                      if (yd.values.
                          super_dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>
                          .elems == (pointer)(uVar3 & 0xffffffff)) {
                        idx._3_1_ = 0;
                      }
                      else {
                        uintwide_t<4096U,_unsigned_int,_std::allocator<unsigned_int>,_false>::
                        uintwide_t<2048U,_false,_nullptr>
                                  ((uintwide_t<4096U,_unsigned_int,_std::allocator<unsigned_int>,_false>
                                    *)local_348,
                                   (uintwide_t<2048U,_unsigned_int,_std::allocator<unsigned_int>,_false>
                                    *)local_310);
                        uintwide_t<4096U,_unsigned_int,_std::allocator<unsigned_int>,_false>::
                        operator*=((uintwide_t<4096U,_unsigned_int,_std::allocator<unsigned_int>,_false>
                                    *)local_348,
                                   (uintwide_t<4096U,_unsigned_int,_std::allocator<unsigned_int>,_false>
                                    *)local_348);
                        uintwide_t<4096U,_unsigned_int,_std::allocator<unsigned_int>,_false>::
                        operator%=((uintwide_t<4096U,_unsigned_int,_std::allocator<unsigned_int>,_false>
                                    *)local_348,
                                   (uintwide_t<4096U,_unsigned_int,_std::allocator<unsigned_int>,_false>
                                    *)&y.values.
                                       super_dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>
                                       .elems);
                        uintwide_t<2048U,_unsigned_int,_std::allocator<unsigned_int>,_false>::
                        uintwide_t<4096U,_false,_nullptr>
                                  (&local_360,
                                   (uintwide_t<4096U,_unsigned_int,_std::allocator<unsigned_int>,_false>
                                    *)local_348);
                        uintwide_t<2048U,_unsigned_int,_std::allocator<unsigned_int>,_false>::
                        operator=((uintwide_t<2048U,_unsigned_int,_std::allocator<unsigned_int>,_false>
                                   *)local_310,&local_360);
                        uintwide_t<2048U,_unsigned_int,_std::allocator<unsigned_int>,_false>::
                        ~uintwide_t(&local_360);
                        uintwide_t<4096U,_unsigned_int,_std::allocator<unsigned_int>,_false>::
                        ~uintwide_t((uintwide_t<4096U,_unsigned_int,_std::allocator<unsigned_int>,_false>
                                     *)local_348);
                      }
                    }
                    bVar1 = miller_rabin<math::wide_integer::uniform_int_distribution<2048U,_unsigned_int,_std::allocator<unsigned_int>,_false>,_std::mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>,_2048U,_unsigned_int,_std::allocator<unsigned_int>,_false>
                            ::anon_class_1_0_00000001::operator()
                                      ((anon_class_1_0_00000001 *)
                                       ((long)&fn.values.
                                               super_dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>
                                               .elems + 3),(local_wide_integer_type *)local_310);
                    if ((bVar1) &&
                       (yd.values.
                        super_dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>
                        .elems != (pointer)0x0)) {
                      idx._3_1_ = 0;
                    }
                    np_dbl.values.
                    super_dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>
                    .elems = (pointer)((long)np_dbl.values.
                                             super_dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>
                                             .elems + 1);
                    uintwide_t<2048U,_unsigned_int,_std::allocator<unsigned_int>,_false>::
                    ~uintwide_t((uintwide_t<2048U,_unsigned_int,_std::allocator<unsigned_int>,_false>
                                 *)local_310);
                    local_3f5 = 0;
                    if (np_dbl.values.
                        super_dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>
                        .elems < number_of_trials) {
                      local_3f5 = idx._3_1_;
                    }
                  } while ((local_3f5 & 1) != 0);
                  n_local._7_1_ = idx._3_1_ & 1;
                  uStack_68 = 1;
                  uintwide_t<4096U,_unsigned_int,_std::allocator<unsigned_int>,_false>::~uintwide_t
                            ((uintwide_t<4096U,_unsigned_int,_std::allocator<unsigned_int>,_false> *
                             )&y.values.
                               super_dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>
                               .elems);
                  uniform_int_distribution<2048U,_unsigned_int,_std::allocator<unsigned_int>,_false>
                  ::param_type::~param_type((param_type *)local_2a0);
                  uintwide_t<2048U,_unsigned_int,_std::allocator<unsigned_int>,_false>::~uintwide_t
                            ((uintwide_t<2048U,_unsigned_int,_std::allocator<unsigned_int>,_false> *
                             )&params.param_b.values.
                               super_dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>
                               .elems);
                }
                uintwide_t<2048U,_unsigned_int,_std::allocator<unsigned_int>,_false>::~uintwide_t
                          ((uintwide_t<2048U,_unsigned_int,_std::allocator<unsigned_int>,_false> *)
                           local_218);
              }
            }
          }
        }
      }
    }
    else {
      local_369 = false;
      if (local_4c == 1) {
        small_primes.elems[0x2e] = 1;
        local_369 = operator==((uintwide_t<2048U,_unsigned_int,_std::allocator<unsigned_int>,_false>
                                *)local_48,small_primes.elems + 0x2e);
      }
      small_primes.elems[0x2f]._3_1_ = local_369;
      if (local_369 == false) {
        memcpy((array<unsigned_int,_48UL> *)((long)&pp0 + 4),&DAT_002e845c,0xc0);
        first = detail::array_detail::array<unsigned_int,_48UL>::cbegin
                          ((array<unsigned_int,_48UL> *)((long)&pp0 + 4));
        last = detail::array_detail::array<unsigned_int,_48UL>::cend
                         ((array<unsigned_int,_48UL> *)((long)&pp0 + 4));
        n_local._7_1_ =
             detail::binary_search_unsafe<unsigned_int_const*,unsigned_int>(first,last,&local_4c);
        uStack_68 = 1;
      }
      else {
        n_local._7_1_ = 0;
        uStack_68 = 1;
      }
    }
  }
  uintwide_t<2048U,_unsigned_int,_std::allocator<unsigned_int>,_false>::~uintwide_t
            ((uintwide_t<2048U,_unsigned_int,_std::allocator<unsigned_int>,_false> *)local_48);
  return (bool)(n_local._7_1_ & 1);
}

Assistant:

auto miller_rabin(const uintwide_t<Width2, LimbType, AllocatorType, IsSigned>& n, // NOLINT(readability-function-cognitive-complexity)
                    const unsigned_fast_type                                     number_of_trials,
                          DistributionType&                                      distribution,
                          GeneratorType&                                         generator) -> bool
  {
    // This Miller-Rabin primality test is loosely based on
    // an adaptation of some code from Boost.Multiprecision.
    // The Boost.Multiprecision code can be found here:
    // https://www.boost.org/doc/libs/1_87_0/libs/multiprecision/doc/html/boost_multiprecision/tut/primetest.html

    // Note: Some comments in this subroutine use the Wolfram Language(TM).
    // These can be exercised at the web links to WolframAlpha(R) provided

    using local_wide_integer_type = uintwide_t<Width2, LimbType, AllocatorType, IsSigned>;
    using local_limb_type         = typename local_wide_integer_type::limb_type;

    const local_wide_integer_type np((!local_wide_integer_type::is_neg(n)) ? n : -n);

    {
      const auto n0 = static_cast<local_limb_type>(np);

      const auto n_is_even =
        (static_cast<local_limb_type>(n0 & static_cast<local_limb_type>(UINT8_C(1))) == static_cast<local_limb_type>(UINT8_C(0)));

      if(n_is_even)
      {
        // The prime candidate is not prime because n is even.
        // Also handle the trivial special case of (n = 2).

        const auto n_is_two =
          ((n0 == static_cast<local_limb_type>(UINT8_C(2))) && (np == static_cast<local_limb_type>(UINT8_C(2))));

        return n_is_two;
      }

      if((n0 <= static_cast<local_limb_type>(UINT8_C(227))) && (np <= static_cast<local_limb_type>(UINT8_C(227))))
      {
        // This handles the trivial special case of the (non-primality) of 1.
        const auto n_is_one =
          ((n0 == static_cast<local_limb_type>(UINT8_C(1))) && (np == static_cast<local_limb_type>(UINT8_C(1))));

        if(n_is_one)
        {
          return false;
        }

        // Exclude pure small primes from 3...227.
        // Table[Prime[i], {i, 2, 49}] =
        // {
        //     3,   5,   7,  11,  13,  17,  19,  23,
        //    29,  31,  37,  41,  43,  47,  53,  59,
        //    61,  67,  71,  73,  79,  83,  89,  97,
        //   101, 103, 107, 109, 113, 127, 131, 137,
        //   139, 149, 151, 157, 163, 167, 173, 179,
        //   181, 191, 193, 197, 199, 211, 223, 227
        // }
        // See also:
        // https://www.wolframalpha.com/input/?i=Table%5BPrime%5Bi%5D%2C+%7Bi%2C+2%2C+49%7D%5D

        constexpr detail::array_detail::array<local_limb_type, static_cast<std::size_t>(UINT8_C(48))> small_primes =
        {
          static_cast<local_limb_type>(UINT8_C(  3)), static_cast<local_limb_type>(UINT8_C(  5)), static_cast<local_limb_type>(UINT8_C(  7)), static_cast<local_limb_type>(UINT8_C( 11)), static_cast<local_limb_type>(UINT8_C( 13)), static_cast<local_limb_type>(UINT8_C( 17)), static_cast<local_limb_type>(UINT8_C( 19)), static_cast<local_limb_type>(UINT8_C( 23)),
          static_cast<local_limb_type>(UINT8_C( 29)), static_cast<local_limb_type>(UINT8_C( 31)), static_cast<local_limb_type>(UINT8_C( 37)), static_cast<local_limb_type>(UINT8_C( 41)), static_cast<local_limb_type>(UINT8_C( 43)), static_cast<local_limb_type>(UINT8_C( 47)), static_cast<local_limb_type>(UINT8_C( 53)), static_cast<local_limb_type>(UINT8_C( 59)),
          static_cast<local_limb_type>(UINT8_C( 61)), static_cast<local_limb_type>(UINT8_C( 67)), static_cast<local_limb_type>(UINT8_C( 71)), static_cast<local_limb_type>(UINT8_C( 73)), static_cast<local_limb_type>(UINT8_C( 79)), static_cast<local_limb_type>(UINT8_C( 83)), static_cast<local_limb_type>(UINT8_C( 89)), static_cast<local_limb_type>(UINT8_C( 97)),
          static_cast<local_limb_type>(UINT8_C(101)), static_cast<local_limb_type>(UINT8_C(103)), static_cast<local_limb_type>(UINT8_C(107)), static_cast<local_limb_type>(UINT8_C(109)), static_cast<local_limb_type>(UINT8_C(113)), static_cast<local_limb_type>(UINT8_C(127)), static_cast<local_limb_type>(UINT8_C(131)), static_cast<local_limb_type>(UINT8_C(137)),
          static_cast<local_limb_type>(UINT8_C(139)), static_cast<local_limb_type>(UINT8_C(149)), static_cast<local_limb_type>(UINT8_C(151)), static_cast<local_limb_type>(UINT8_C(157)), static_cast<local_limb_type>(UINT8_C(163)), static_cast<local_limb_type>(UINT8_C(167)), static_cast<local_limb_type>(UINT8_C(173)), static_cast<local_limb_type>(UINT8_C(179)),
          static_cast<local_limb_type>(UINT8_C(181)), static_cast<local_limb_type>(UINT8_C(191)), static_cast<local_limb_type>(UINT8_C(193)), static_cast<local_limb_type>(UINT8_C(197)), static_cast<local_limb_type>(UINT8_C(199)), static_cast<local_limb_type>(UINT8_C(211)), static_cast<local_limb_type>(UINT8_C(223)), static_cast<local_limb_type>(UINT8_C(227))
        };

        return detail::binary_search_unsafe(small_primes.cbegin(), small_primes.cend(), n0);
      }
    }

    // Check small factors.

    // Exclude small prime factors from { 3 ...  53 }.
    // Product[Prime[i], {i, 2, 16}] = 16294579238595022365
    // See also: https://www.wolframalpha.com/input/?i=Product%5BPrime%5Bi%5D%2C+%7Bi%2C+2%2C+16%7D%5D
    {
      constexpr std::uint64_t pp0 = UINT64_C(16294579238595022365);

      const auto m0 = static_cast<std::uint64_t>(np % pp0);

      if((m0 == static_cast<std::uint64_t>(UINT8_C(0))) || (detail::integer_gcd_reduce(m0, pp0) != static_cast<std::uint64_t>(UINT8_C(1))))
      {
        return false;
      }
    }

    // Exclude small prime factors from { 59 ... 101 }.
    // Product[Prime[i], {i, 17, 26}] = 7145393598349078859
    // See also: https://www.wolframalpha.com/input/?i=Product%5BPrime%5Bi%5D%2C+%7Bi%2C+17%2C+26%7D%5D
    {
      constexpr std::uint64_t pp1 = UINT64_C(7145393598349078859);

      const auto m1 = static_cast<std::uint64_t>(np % pp1);

      if((m1 == static_cast<std::uint64_t>(UINT8_C(0))) || (detail::integer_gcd_reduce(m1, pp1) != static_cast<std::uint64_t>(UINT8_C(1))))
      {
        return false;
      }
    }

    // Exclude small prime factors from { 103 ... 149 }.
    // Product[Prime[i], {i, 27, 35}] = 6408001374760705163
    // See also: https://www.wolframalpha.com/input/?i=Product%5BPrime%5Bi%5D%2C+%7Bi%2C+27%2C+35%7D%5D
    {
      constexpr std::uint64_t pp2 = UINT64_C(6408001374760705163);

      const auto m2 = static_cast<std::uint64_t>(np % pp2);

      if((m2 == static_cast<std::uint64_t>(UINT8_C(0))) || (detail::integer_gcd_reduce(m2, pp2) != static_cast<std::uint64_t>(UINT8_C(1))))
      {
        return false;
      }
    }

    // Exclude small prime factors from { 151 ... 191 }.
    // Product[Prime[i], {i, 36, 43}] = 690862709424854779
    // See also: https://www.wolframalpha.com/input/?i=Product%5BPrime%5Bi%5D%2C+%7Bi%2C+36%2C+43%7D%5D
    {
      constexpr std::uint64_t pp3 = UINT64_C(690862709424854779);

      const auto m3 = static_cast<std::uint64_t>(np % pp3);

      if((m3 == static_cast<std::uint64_t>(UINT8_C(0))) || (detail::integer_gcd_reduce(m3, pp3) != static_cast<std::uint64_t>(UINT8_C(1))))
      {
        return false;
      }
    }

    // Exclude small prime factors from { 193 ... 227 }.
    // Product[Prime[i], {i, 44, 49}] = 80814592450549
    // See also: https://www.wolframalpha.com/input/?i=Product%5BPrime%5Bi%5D%2C+%7Bi%2C+44%2C+49%7D%5D
    {
      constexpr std::uint64_t pp4 = UINT64_C(80814592450549);

      const auto m4 = static_cast<std::uint64_t>(np % pp4);

      if((m4 == static_cast<std::uint64_t>(UINT8_C(0))) || (detail::integer_gcd_reduce(m4, pp4) != static_cast<std::uint64_t>(UINT8_C(1))))
      {
        return false;
      }
    }

    const local_wide_integer_type nm1 { np - static_cast<unsigned>(UINT8_C(1)) };

    auto
      local_functor_isone
      {
        [](const local_wide_integer_type& t1)
        {
          return
          (
               (static_cast<local_limb_type>(t1) == local_limb_type { UINT8_C(1) })
            && (t1 == unsigned { UINT8_C(1) })
          );
        }
      };

    // Since we have already excluded all small factors
    // up to and including 227, n is greater than 227.

    {
      // Perform a single Fermat test which will
      // exclude many non-prime candidates.

      const local_wide_integer_type fn { powm(local_wide_integer_type(static_cast<local_limb_type>(228U)), nm1, np) };

      if(!local_functor_isone(fn))
      {
        return false;
      }
    }

    const unsigned k { static_cast<unsigned>(lsb(nm1)) };

    const local_wide_integer_type q { nm1 >> k };

    using local_param_type = typename DistributionType::param_type;

    const local_param_type
      params
      {
        local_wide_integer_type { unsigned { UINT8_C(2) } },
        np - unsigned { UINT8_C(2) }
      };

    // Assume the test will pass, even though it usually does not pass.
    bool result_candidate_is_prime { true };

    ::std::size_t idx { UINT8_C(0) };

    using local_double_width_type = typename local_wide_integer_type::double_width_type;

    const local_double_width_type np_dbl { np };

    // Loop over the trials to perform the primality testing.
    do
    {
      local_wide_integer_type y { powm(distribution(generator, params), q, np) };

      ::std::size_t jdx { UINT8_C(0) };

      // Continue while y is not nm1, and while y is not 1,
      // and while the result is true.

      while((y != nm1) && (!local_functor_isone(y)) && result_candidate_is_prime) // NOLINT(altera-id-dependent-backward-branch)
      {
        ++jdx;

        if(jdx == static_cast<std::size_t>(k))
        {
          // Mark failure if max iterations reached.
          result_candidate_is_prime = false;
        }
        else
        {
          // Continue with the next value of y.

          // Manually calculate: y = powm(y, 2, np);

          local_double_width_type yd { y };

          yd *= yd;
          yd %= np_dbl;

          y = local_wide_integer_type { yd };
        }
      }

      // Check for (y == 1) after the loop.
      if(local_functor_isone(y) && (jdx != ::std::size_t { UINT8_C(0) }))
      {
        // Mark failure if (y == 1) and (jdx != 0).
        result_candidate_is_prime = false;
      }

      ++idx;
    }
    while((idx < number_of_trials) && result_candidate_is_prime);

    return result_candidate_is_prime;
  }